

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

void sb_bmp_barrier_on(superblock *sb)

{
  uint64_t uVar1;
  long in_RDI;
  
  atomic_incr_uint64_t((atomic<unsigned_long> *)sb,(memory_order)((ulong)in_RDI >> 0x20));
  uVar1 = atomic_get_uint64_t((atomic<unsigned_long> *)sb,(memory_order)((ulong)in_RDI >> 0x20));
  if (uVar1 != 0) {
    atomic_decr_uint64_t((atomic<unsigned_long> *)sb,(memory_order)((ulong)in_RDI >> 0x20));
    pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x38));
    atomic_incr_uint64_t((atomic<unsigned_long> *)sb,(memory_order)((ulong)in_RDI >> 0x20));
    pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x38));
  }
  return;
}

Assistant:

static void sb_bmp_barrier_on(struct superblock *sb)
{
    atomic_incr_uint64_t(&sb->bmp_rcount);
    if (atomic_get_uint64_t(&sb->bmp_wcount)) {
        // now bmp pointer & related variables are being changed.
        // decrease count and grab lock until the change is done.
        atomic_decr_uint64_t(&sb->bmp_rcount);
        spin_lock(&sb->bmp_lock);

        // got control: means that change is done.
        // re-increase the count
        atomic_incr_uint64_t(&sb->bmp_rcount);
        spin_unlock(&sb->bmp_lock);
    }
}